

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall
hwtest::pgraph::MthdCelsiusBlendFuncEnable::emulate_mthd(MthdCelsiusBlendFuncEnable *this)

{
  pgraph_state *state;
  uint32_t val;
  uint uVar1;
  uint err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  err = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4 |
        (uint)(1 < uVar1);
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    val = ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_blend & 0xfffffff7
          ) + (uVar1 & 1) * 8;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_blend = val;
    pgraph_celsius_icmd(state,0x20,val,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (val > 1)
			err |= 1;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_blend, 3, 1, val);
				pgraph_celsius_icmd(&exp, 0x20, exp.bundle_blend, true);
			}
		}
	}